

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *flv;
  FILE *flv_00;
  uint uVar3;
  int has_video;
  int has_audio;
  flvtag_t tag;
  char partyDudes [64];
  
  flv = flv_open_read(argv[1]);
  flv_00 = flv_open_write(argv[2]);
  flvtag_init(&tag);
  iVar1 = flv_read_header(flv,&has_audio,&has_video);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s is not an flv file\n",argv[1]);
    iVar1 = 1;
  }
  else {
    flv_write_header(flv_00,has_audio,has_video);
    uVar3 = 1000;
    iVar1 = 0;
    while( true ) {
      iVar2 = flv_read_tag(flv,&tag);
      if (iVar2 == 0) break;
      if (((((*tag.data & 0x1f) == 9) && ((tag.data[0xb] & 0xf) == 7)) && (tag.data[0xc] == '\x01'))
         && (uVar3 <= ((uint)tag.data[6] |
                      (uint)tag.data[5] << 8 | (uint)tag.data[4] << 0x10 | (uint)tag.data[7] << 0x18
                      ))) {
        get_dudes(partyDudes);
        flvtag_addcaption_text(&tag,partyDudes);
        fprintf(_stderr,"%d: %s\n",(ulong)uVar3,partyDudes);
        uVar3 = uVar3 + 500;
      }
      flv_write_tag(flv_00,&tag);
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    uint32_t nextParty = 1000;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    char partyDudes[64];

    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {

        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && nextParty <= flvtag_timestamp(&tag)) {
            get_dudes(partyDudes);

            if (CAPTION_METHOD == CAPTION_METHOD_SEI_708) {
                flvtag_addcaption_text(&tag, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_708(out, nextParty, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_utf8(out, nextParty, partyDudes);
            } else {
                fprintf(stderr, "Unknnow method\n");
                return EXIT_FAILURE;
            }

            fprintf(stderr, "%d: %s\n", nextParty, partyDudes);
            nextParty += 500; // party all the time
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}